

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_span.h
# Opt level: O1

reference __thiscall S2PointLoopSpan::operator[](S2PointLoopSpan *this,int i)

{
  uint uVar1;
  ulong uVar2;
  S2LogMessage local_10;
  
  if (i < 0) {
    S2LogMessage::S2LogMessage
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x32,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_10.stream_,"Check failed: (i) >= (0) ",0x19);
  }
  else {
    if ((ulong)(uint)i < (this->super_S2PointSpan).len_ * 2) {
      uVar1 = i - (int)(this->super_S2PointSpan).len_;
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 0) {
        uVar2 = (ulong)(uint)i;
      }
      return (this->super_S2PointSpan).ptr_ + uVar2;
    }
    S2LogMessage::S2LogMessage
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x33,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_10.stream_,"Check failed: (i) < (2 * size()) ",0x21);
  }
  abort();
}

Assistant:

reference operator[](int i) const noexcept {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * size());
    int j = i - static_cast<int>(size());
    return S2PointSpan::operator[](j < 0 ? i : j);
  }